

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcOper.h
# Opt level: O2

char * Abc_OperName(int Type)

{
  switch(Type) {
  case 0:
  case 99:
    return (char *)0x0;
  case 1:
    return "pi";
  case 2:
    return "po";
  case 3:
    return "ci";
  case 4:
    return "co";
  case 5:
    return "fon";
  case 6:
    return "box";
  default:
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/miniaig/abcOper.h"
                  ,0xe7,"const char *Abc_OperName(int)");
  case 0xb:
    return "buf";
  case 0xc:
    return "~";
  case 0xd:
  case 0x1e:
    return "&";
  case 0xe:
  case 0x1f:
    return "~&";
  case 0xf:
  case 0x20:
    return "|";
  case 0x10:
  case 0x21:
    return "~|";
  case 0x11:
  case 0x22:
    return "^";
  case 0x12:
  case 0x23:
    return "~^";
  case 0x15:
    return "mux";
  case 0x16:
    return "maj";
  case 0x24:
    return "!";
  case 0x25:
    return "&&";
  case 0x27:
    return "||";
  case 0x29:
    return "^^";
  case 0x32:
    return "+";
  case 0x33:
  case 0x3a:
    return "-";
  case 0x34:
  case 0x35:
    return "*";
  case 0x36:
    return "/";
  case 0x37:
    return "mod";
  case 0x38:
    return "%";
  case 0x39:
    return "**";
  case 0x3b:
    return "sqrt";
  case 0x3e:
    return "<";
  case 0x3f:
    return "<=";
  case 0x40:
    return ">=";
  case 0x41:
    return ">";
  case 0x42:
    return "==";
  case 0x43:
    return "!=";
  case 0x44:
    return "<<";
  case 0x45:
    return ">>";
  case 0x46:
    return "<<<";
  case 0x47:
    return ">>>";
  case 0x48:
    return "rotL";
  case 0x49:
    return "rotR";
  case 0x4b:
    return "lut";
  case 0x4d:
    return "table";
  case 0x59:
    return "DFFRSE";
  case 0x5b:
    return "[:]";
  case 0x5c:
    return "{}";
  case 0x5d:
    return "zPad";
  case 0x5e:
    return "sExt";
  case 0x5f:
    return "=>";
  case 0x60:
    return "squar";
  case 0x61:
    return "const";
  }
}

Assistant:

static inline const char * Abc_OperName( int Type )
{
    if ( Type == ABC_OPER_NONE         )   return NULL;
    if ( Type == ABC_OPER_PI           )   return "pi";     
    if ( Type == ABC_OPER_PO           )   return "po";     
    if ( Type == ABC_OPER_CI           )   return "ci";     
    if ( Type == ABC_OPER_CO           )   return "co";     
    if ( Type == ABC_OPER_FON          )   return "fon";     
    if ( Type == ABC_OPER_BOX          )   return "box";    
    
    if ( Type == ABC_OPER_BIT_BUF      )   return "buf";    
    if ( Type == ABC_OPER_BIT_INV      )   return "~";      
    if ( Type == ABC_OPER_BIT_MUX      )   return "mux";    
    if ( Type == ABC_OPER_BIT_MAJ      )   return "maj";    
    if ( Type == ABC_OPER_BIT_AND      )   return "&";      
    if ( Type == ABC_OPER_BIT_OR       )   return "|";      
    if ( Type == ABC_OPER_BIT_XOR      )   return "^";      
    if ( Type == ABC_OPER_BIT_NAND     )   return "~&";     
    if ( Type == ABC_OPER_BIT_NOR      )   return "~|";     
    if ( Type == ABC_OPER_BIT_NXOR     )   return "~^";     

    if ( Type == ABC_OPER_RED_AND      )   return "&";      
    if ( Type == ABC_OPER_RED_OR       )   return "|";      
    if ( Type == ABC_OPER_RED_XOR      )   return "^";      
    if ( Type == ABC_OPER_RED_NAND     )   return "~&";     
    if ( Type == ABC_OPER_RED_NOR      )   return "~|";     
    if ( Type == ABC_OPER_RED_NXOR     )   return "~^";     

    if ( Type == ABC_OPER_LOGIC_NOT    )   return "!";      
    if ( Type == ABC_OPER_LOGIC_IMPL   )   return "=>";     
    if ( Type == ABC_OPER_LOGIC_AND    )   return "&&";     
    if ( Type == ABC_OPER_LOGIC_OR     )   return "||";     
    if ( Type == ABC_OPER_LOGIC_XOR    )   return "^^";   

    if ( Type == ABC_OPER_ARI_ADD      )   return "+";      
    if ( Type == ABC_OPER_ARI_SUB      )   return "-";      
    if ( Type == ABC_OPER_ARI_MUL      )   return "*";      
    if ( Type == ABC_OPER_ARI_SMUL     )   return "*";      
    if ( Type == ABC_OPER_ARI_DIV      )   return "/";      
    if ( Type == ABC_OPER_ARI_REM      )   return "%";      
    if ( Type == ABC_OPER_ARI_MOD      )   return "mod";    
    if ( Type == ABC_OPER_ARI_POW      )   return "**";     
    if ( Type == ABC_OPER_ARI_MIN      )   return "-";      
    if ( Type == ABC_OPER_ARI_SQRT     )   return "sqrt";   
    if ( Type == ABC_OPER_ARI_SQUARE   )   return "squar";  
    
    if ( Type == ABC_OPER_COMP_EQU     )   return "==";     
    if ( Type == ABC_OPER_COMP_NOTEQU  )   return "!=";     
    if ( Type == ABC_OPER_COMP_LESS    )   return "<";      
    if ( Type == ABC_OPER_COMP_MORE    )   return ">";      
    if ( Type == ABC_OPER_COMP_LESSEQU )   return "<=";     
    if ( Type == ABC_OPER_COMP_MOREEQU )   return ">=";     

    if ( Type == ABC_OPER_SHIFT_L      )   return "<<";     
    if ( Type == ABC_OPER_SHIFT_R      )   return ">>";     
    if ( Type == ABC_OPER_SHIFT_LA     )   return "<<<";    
    if ( Type == ABC_OPER_SHIFT_RA     )   return ">>>";    
    if ( Type == ABC_OPER_SHIFT_ROTL   )   return "rotL";   
    if ( Type == ABC_OPER_SHIFT_ROTR   )   return "rotR";   

    if ( Type == ABC_OPER_DFFRSE       )   return "DFFRSE";    

    if ( Type == ABC_OPER_SLICE        )   return "[:]";    
    if ( Type == ABC_OPER_CONCAT       )   return "{}";     
    if ( Type == ABC_OPER_ZEROPAD      )   return "zPad";   
    if ( Type == ABC_OPER_SIGNEXT      )   return "sExt";   

    if ( Type == ABC_OPER_CONST        )   return "const";  
    if ( Type == ABC_OPER_TABLE        )   return "table";  
    if ( Type == ABC_OPER_LUT          )   return "lut";  
    if ( Type == ABC_OPER_LAST         )   return NULL;     
    assert( 0 );
    return NULL;
}